

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3VdbeMemSetZeroBlob(Mem *pMem,int n)

{
  int iVar1;
  
  if (((pMem->flags & 0x2460) != 0) || (pMem->szMalloc != 0)) {
    vdbeMemClear(pMem);
  }
  pMem->flags = 0x4010;
  pMem->n = 0;
  iVar1 = 0;
  if (0 < n) {
    iVar1 = n;
  }
  (pMem->u).nZero = iVar1;
  pMem->enc = '\x01';
  pMem->z = (char *)0x0;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMemSetZeroBlob(Mem *pMem, int n){
  sqlite3VdbeMemRelease(pMem);
  pMem->flags = MEM_Blob|MEM_Zero;
  pMem->n = 0;
  if( n<0 ) n = 0;
  pMem->u.nZero = n;
  pMem->enc = SQLITE_UTF8;
  pMem->z = 0;
}